

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

float32 helper_recps_f32_aarch64(float32 a,float32 b,CPUARMState_conflict *env)

{
  float32 fVar1;
  float_status *s;
  bool bVar2;
  
  s = &(env->vfp).standard_fp_status;
  if ((b & 0x7f800000) == 0 && (a & 0x7fffffff) == 0x7f800000) {
    bVar2 = (b & 0x7fffff) == 0;
  }
  else {
    if ((a & 0x7f800000) != 0 || (b & 0x7fffffff) != 0x7f800000) {
      fVar1 = float32_mul_aarch64(a,b,s);
      fVar1 = float32_sub_aarch64(0x40000000,fVar1,s);
      return fVar1;
    }
    bVar2 = false;
  }
  if ((a & 0x7fffffff) != 0 && !bVar2) {
    float_raise_aarch64('@',s);
  }
  return 0x40000000;
}

Assistant:

float32 HELPER(recps_f32)(float32 a, float32 b, CPUARMState *env)
{
    float_status *s = &env->vfp.standard_fp_status;
    if ((float32_is_infinity(a) && float32_is_zero_or_denormal(b)) ||
        (float32_is_infinity(b) && float32_is_zero_or_denormal(a))) {
        if (!(float32_is_zero(a) || float32_is_zero(b))) {
            float_raise(float_flag_input_denormal, s);
        }
        return float32_two;
    }
    return float32_sub(float32_two, float32_mul(a, b, s), s);
}